

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_printer.h
# Opt level: O0

void MyGame_Example_Any_print_json_union
               (flatcc_json_printer_t *ctx,flatcc_json_printer_union_descriptor_t *ud)

{
  flatcc_json_printer_union_descriptor_t *ud_local;
  flatcc_json_printer_t *ctx_local;
  
  switch(ud->type) {
  case '\x01':
    flatcc_json_printer_union_table(ctx,ud,MyGame_Example_Monster_print_json_table);
    break;
  case '\x02':
    flatcc_json_printer_union_table(ctx,ud,MyGame_Example_TestSimpleTableWithEnum_print_json_table);
    break;
  case '\x03':
    flatcc_json_printer_union_table(ctx,ud,MyGame_Example2_Monster_print_json_table);
    break;
  case '\x04':
    flatcc_json_printer_union_table(ctx,ud,MyGame_Example_Alt_print_json_table);
  }
  return;
}

Assistant:

static void MyGame_Example_Any_print_json_union(flatcc_json_printer_t *ctx, flatcc_json_printer_union_descriptor_t *ud)
{
    switch (ud->type) {
    case 1:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example_Monster_print_json_table);
        break;
    case 2:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example_TestSimpleTableWithEnum_print_json_table);
        break;
    case 3:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example2_Monster_print_json_table);
        break;
    case 4:
        flatcc_json_printer_union_table(ctx, ud, MyGame_Example_Alt_print_json_table);
        break;
    default:
        break;
    }
}